

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::refineregion
          (tetgenmesh *this,face *splitsh,arraypool *cavpoints,arraypool *cavfaces,
          arraypool *cavshells,arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  tetrahedron *pppdVar1;
  long lVar2;
  shellface *pppdVar3;
  shellface ppdVar4;
  shellface ppdVar5;
  memorypool *pmVar6;
  arraypool *paVar7;
  tetrahedron *pppdVar8;
  point pdVar9;
  int i;
  int iVar10;
  interresult iVar11;
  unsigned_long uVar12;
  tetrahedron ppdVar13;
  ulong uVar14;
  long lVar15;
  tetrahedron *pppdVar16;
  arraypool *paVar17;
  triface searchtet;
  point steinpt;
  face splitseg;
  point refpt;
  insertvertexflags ivf;
  
  searchtet.tet = (tetrahedron *)0x0;
  searchtet.ver = 0;
  splitseg.sh = (shellface *)0x0;
  splitseg.shver = 0;
  ivf.refinetet.tet = (tetrahedron *)0x0;
  ivf.refinetet.ver = 0;
  ivf.refinesh.sh = (shellface *)0x0;
  ivf.refinesh.shver = 0;
  ivf.smlenflag = 0;
  ivf.smlen = 0.0;
  ivf.iloc = 0;
  ivf.bowywat = 0;
  ivf.lawson = 0;
  ivf.splitbdflag = 0;
  ivf.validflag = 0;
  ivf.respectbdflag = 0;
  ivf.rejflag = 0;
  ivf.chkencflag = 0;
  ivf.cdtflag = 0;
  ivf.assignmeshsize = 0;
  ivf.sloc = 0;
  ivf.sbowywat = 0;
  ivf.refineflag = 0;
  lVar2 = this->points->items;
  if (2 < this->b->verbose) {
    pppdVar3 = splitsh->sh;
    iVar10 = splitsh->shver;
    lVar15 = (long)this->pointmarkindex;
    printf("      Refining region at edge (%d, %d, %d).\n",
           (ulong)*(uint *)((long)pppdVar3[sorgpivot[iVar10]] + lVar15 * 4),
           (ulong)*(uint *)((long)pppdVar3[sdestpivot[iVar10]] + lVar15 * 4),
           (ulong)*(uint *)((long)pppdVar3[sapexpivot[iVar10]] + lVar15 * 4));
  }
  ppdVar4 = splitsh->sh[sorgpivot[splitsh->shver]];
  ppdVar5 = splitsh->sh[sdestpivot[splitsh->shver]];
  makepoint(this,&steinpt,FREEFACETVERTEX);
  pdVar9 = steinpt;
  lVar15 = 0;
  do {
    steinpt[lVar15] = ((double)ppdVar4[lVar15] + (double)ppdVar5[lVar15]) * 0.5;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  ivf.sloc = 4;
  ivf.sbowywat = 1;
  ivf.assignmeshsize = this->b->metric;
  ivf.cdtflag = 1;
  ivf.smlenflag = this->useinsertradius;
  searchtet.tet = (tetrahedron *)((ulong)ppdVar4[this->point2simindex] & 0xfffffffffffffff0);
  if (searchtet.tet[4] == ppdVar4) {
    searchtet.ver = 0xb;
  }
  else if (searchtet.tet[5] == ppdVar4) {
    searchtet.ver = 3;
  }
  else {
    searchtet.ver = 7;
    if (searchtet.tet[6] != ppdVar4) {
      searchtet.ver = 0;
    }
  }
  ivf.bowywat = 1;
  ivf.iloc = 1;
  ivf.rejflag = 1;
  paVar17 = crosstets;
  iVar10 = insertpoint_cdt(this,steinpt,&searchtet,splitsh,(face *)0x0,&ivf,cavpoints,cavfaces,
                           cavshells,newtets,crosstets,misfaces);
  if (iVar10 != 0) {
    if (this->useinsertradius != 0) {
      save_facetpoint_insradius(this,pdVar9,ivf.parentpt,ivf.smlen);
    }
    this->st_facref_count = this->st_facref_count + 1;
LAB_00133a68:
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
    paVar7 = this->subsegstack;
    lVar15 = paVar7->objects;
    do {
      if (lVar15 < 1) {
        if (2 < this->b->verbose) {
          printf("      Added %ld Steiner points.\n",this->points->items - lVar2);
        }
        return;
      }
      uVar14 = lVar15 - 1;
      paVar7->objects = uVar14;
      lVar15 = (long)paVar7->objectbytes * ((long)paVar7->objectsperblockmark & uVar14);
      splitseg.sh = *(shellface **)
                     (paVar7->toparray[(long)uVar14 >> ((byte)paVar7->log2objectsperblock & 0x3f)] +
                     lVar15);
      splitseg.shver =
           *(int *)(paVar7->toparray[(long)uVar14 >> ((byte)paVar7->log2objectsperblock & 0x3f)] +
                   lVar15 + 8);
      searchtet.ver = (uint)splitseg.sh[9] & 0xf;
      searchtet.tet = (tetrahedron *)((ulong)splitseg.sh[9] & 0xfffffffffffffff0);
      if (searchtet.tet == (tetrahedron *)0x0) {
        iVar11 = scoutsegment(this,(point)splitseg.sh[sorgpivot[splitseg.shver]],
                              (point)splitseg.sh[sdestpivot[splitseg.shver]],&splitseg,&searchtet,
                              &refpt,paVar17);
        pppdVar8 = searchtet.tet;
        if (iVar11 == SHAREEDGE) {
          uVar14 = (ulong)searchtet.ver;
          splitseg.sh[9] = (shellface)(uVar14 | (ulong)searchtet.tet);
          pppdVar16 = searchtet.tet;
          do {
            if (pppdVar16[8] == (tetrahedron)0x0) {
              ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2segpool);
              pppdVar16[8] = ppdVar13;
              lVar15 = 0;
              do {
                pppdVar16[8][lVar15] = (double *)0x0;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 6);
            }
            iVar10 = (int)uVar14;
            pppdVar16[8][ver2edge[iVar10]] = (double *)((long)splitseg.shver | (ulong)splitseg.sh);
            pppdVar1 = pppdVar16 + facepivot1[iVar10];
            pppdVar16 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
            uVar14 = (ulong)(uint)facepivot2[iVar10][(uint)*pppdVar1 & 0xf];
          } while (pppdVar8 != pppdVar16);
        }
        else {
          if ((iVar11 & ~INTERSECT) != ACROSSEDGE) goto LAB_00133d15;
          makepoint(this,&steinpt,FREESEGVERTEX);
          pdVar9 = steinpt;
          getsteinerptonsegment(this,&splitseg,refpt,steinpt);
          ivf.iloc = 1;
          ivf.rejflag = 0;
          paVar17 = crosstets;
          iVar10 = insertpoint_cdt(this,pdVar9,&searchtet,splitsh,&splitseg,&ivf,cavpoints,cavfaces,
                                   cavshells,newtets,crosstets,misfaces);
          if (iVar10 == 0) goto LAB_00133d15;
          if (this->useinsertradius != 0) {
            save_segmentpoint_insradius(this,pdVar9,ivf.parentpt,ivf.smlen);
          }
          this->st_segref_count = this->st_segref_count + 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
        }
      }
      paVar7 = this->subsegstack;
      lVar15 = paVar7->objects;
    } while( true );
  }
  if (ivf.iloc == 7) {
    *(uint *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)pdVar9 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar6 = this->points;
    *pdVar9 = (double)pmVar6->deaditemstack;
    pmVar6->deaditemstack = pdVar9;
    pmVar6->items = pmVar6->items + -1;
    uVar12 = randomnation(this,(uint)this->encseglist->objects);
    paVar17 = this->encseglist;
    lVar15 = (long)paVar17->objectbytes * (long)(int)((uint)uVar12 & paVar17->objectsperblockmark);
    splitseg.sh = *(shellface **)
                   (paVar17->toparray
                    [(int)(uint)uVar12 >> ((byte)paVar17->log2objectsperblock & 0x1f)] + lVar15);
    splitseg.shver =
         *(int *)(paVar17->toparray
                  [(int)(uint)uVar12 >> ((byte)paVar17->log2objectsperblock & 0x1f)] + lVar15 + 8);
    paVar17->objects = 0;
    ppdVar13 = splitseg.sh[sorgpivot[splitseg.shver]];
    ppdVar4 = splitseg.sh[sdestpivot[splitseg.shver]];
    makepoint(this,&steinpt,FREESEGVERTEX);
    pdVar9 = steinpt;
    lVar15 = 0;
    do {
      steinpt[lVar15] = ((double)ppdVar13[lVar15] + (double)ppdVar4[lVar15]) * 0.5;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    searchtet.tet = (tetrahedron *)((ulong)ppdVar13[this->point2simindex] & 0xfffffffffffffff0);
    if (searchtet.tet[4] == ppdVar13) {
      searchtet.ver = 0xb;
    }
    else if (searchtet.tet[5] == ppdVar13) {
      searchtet.ver = 3;
    }
    else {
      searchtet.ver = 7;
      if (searchtet.tet[6] != ppdVar13) {
        searchtet.ver = 0;
      }
    }
    ivf.iloc = 1;
    ivf.rejflag = 0;
    paVar17 = crosstets;
    iVar10 = insertpoint_cdt(this,steinpt,&searchtet,splitsh,&splitseg,&ivf,cavpoints,cavfaces,
                             cavshells,newtets,crosstets,misfaces);
    if (iVar10 != 0) {
      if (this->useinsertradius != 0) {
        save_segmentpoint_insradius(this,pdVar9,ivf.parentpt,ivf.smlen);
      }
      this->st_segref_count = this->st_segref_count + 1;
      goto LAB_00133a68;
    }
  }
LAB_00133d15:
  puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
  puts("  the message above, your input data set, and the exact");
  puts("  command line you used to run this program, thank you.");
  exit(2);
}

Assistant:

void tetgenmesh::refineregion(face &splitsh, arraypool *cavpoints, 
                              arraypool *cavfaces, arraypool *cavshells,
                              arraypool *newtets, arraypool *crosstets,
                              arraypool *misfaces)
{
  triface searchtet, spintet;
  face splitseg, *paryseg;
  point steinpt, pa, pb, refpt;
  insertvertexflags ivf;
  enum interresult dir;
  long baknum = points->items;
  int t1ver;
  int i;

  if (b->verbose > 2) {
    printf("      Refining region at edge (%d, %d, %d).\n",
           pointmark(sorg(splitsh)), pointmark(sdest(splitsh)),
           pointmark(sapex(splitsh)));
  }

  // Add the Steiner point at the barycenter of the face.
  pa = sorg(splitsh);
  pb = sdest(splitsh);
  // Create a new point.
  makepoint(&steinpt, FREEFACETVERTEX);
  for (i = 0; i < 3; i++) {
    steinpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  ivf.bowywat = 1; // Use the Bowyer-Watson algorrithm.
  ivf.cdtflag = 1; // Only create the initial cavity.
  ivf.sloc = (int) ONEDGE;
  ivf.sbowywat = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  point2tetorg(pa, searchtet); // Start location from it.
  ivf.iloc = (int) OUTSIDE;

  ivf.rejflag = 1; // Reject it if it encroaches upon any segment.
  if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, NULL, &ivf, cavpoints,
                       cavfaces, cavshells, newtets, crosstets, misfaces)) {
    if (ivf.iloc == (int) ENCSEGMENT) {
      pointdealloc(steinpt);
      // Split an encroached segment.
      i = randomnation(encseglist->objects);
      paryseg = (face *) fastlookup(encseglist, i);
      splitseg = *paryseg;
      encseglist->restart();

      // Split the segment.
      pa = sorg(splitseg);
      pb = sdest(splitseg);
      // Create a new point.
      makepoint(&steinpt, FREESEGVERTEX);
      for (i = 0; i < 3; i++) {
        steinpt[i] = 0.5 * (pa[i] + pb[i]);
      }
      point2tetorg(pa, searchtet);
      ivf.iloc = (int) OUTSIDE;
      ivf.rejflag = 0;
      if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                           cavpoints, cavfaces, cavshells, newtets, 
                           crosstets, misfaces)) {
        terminatetetgen(this, 2); 
      }
      if (useinsertradius) {
        save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
      }
      st_segref_count++;
      if (steinerleft > 0) steinerleft--;
    } else {
      terminatetetgen(this, 2); // assert(0);
    }
  } else {
    if (useinsertradius) {
      save_facetpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
    }
    st_facref_count++;
    if (steinerleft > 0) steinerleft--;
  }

  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    paryseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    splitseg = *paryseg;

    // Check if this segment has been recovered.
    sstpivot1(splitseg, searchtet);
    if (searchtet.tet != NULL) continue;

    // Search the segment.
    dir = scoutsegment(sorg(splitseg), sdest(splitseg), &splitseg, &searchtet, 
                       &refpt, NULL);
    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(splitseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, splitseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else { 
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // Split the segment.
        makepoint(&steinpt, FREESEGVERTEX);
        getsteinerptonsegment(&splitseg, refpt, steinpt);
        ivf.iloc = (int) OUTSIDE;
        ivf.rejflag = 0;
        if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                             cavpoints, cavfaces, cavshells, newtets, 
                             crosstets, misfaces)) {
          terminatetetgen(this, 2);
        }
        if (useinsertradius) {
          save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
        }
        st_segref_count++;
        if (steinerleft > 0) steinerleft--;
      } else {
        terminatetetgen(this, 2);
      }
    }
  } // while

  if (b->verbose > 2) {
    printf("      Added %ld Steiner points.\n", points->items - baknum);
  }
}